

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::canEnterLiteral(ClauseMatcher *this,CodeOp *op)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  _Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false> _Var2;
  bool bVar3;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar4
  ;
  MatchInfo **ppMVar5;
  bool bVar6;
  ulong uVar7;
  ILStruct *targets;
  ulong uVar8;
  ILStruct *this_00;
  
  this_00 = (ILStruct *)(op->_content >> 3);
  if ((this_00->timestamp == (this->tree->super_CodeTree)._curTimeStamp) &&
     (this_00->visited != false)) {
LAB_002b843b:
    bVar6 = false;
  }
  else {
    pRVar4 = (this->lms)._stack;
    pRVar1 = (this->lms)._cursor;
    bVar6 = true;
    if (0x10 < (ulong)((long)pRVar1 - (long)pRVar4)) {
      if ((this_00->varCnt != 0) &&
         (_Var2._M_head_impl =
               pRVar1[-1]._self._M_t.
               super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
               _M_head_impl, (_Var2._M_head_impl)->_eagerlyMatched == false)) {
        LiteralMatcher::doEagerMatching(_Var2._M_head_impl);
        pRVar4 = (this->lms)._stack;
        if ((long)(this->lms)._cursor - (long)pRVar4 == 0x10) {
          return true;
        }
      }
      uVar7 = 0;
      do {
        _Var2._M_head_impl =
             pRVar4[uVar7]._self._M_t.
             super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
             .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
        targets = (ILStruct *)(**(ulong **)&(_Var2._M_head_impl)->super_Matcher >> 3);
        if ((targets->varCnt != 0) && ((_Var2._M_head_impl)->_eagerlyMatched == false)) {
          LiteralMatcher::doEagerMatching(_Var2._M_head_impl);
        }
        uVar8 = (ulong)this_00->matchCnt;
        if (uVar8 == 0) goto LAB_002b843b;
        do {
          uVar8 = uVar8 - 1;
          ppMVar5 = CodeTree::ILStruct::getMatch(this_00,(uint)uVar8);
          bVar3 = existsCompatibleMatch(this,this_00,*ppMVar5,targets);
          if (!bVar3) {
            CodeTree::ILStruct::deleteMatch(this_00,(uint)uVar8);
          }
        } while (uVar8 != 0);
        if (this_00->matchCnt == 0) goto LAB_002b843b;
        uVar7 = uVar7 + 1;
        pRVar4 = (this->lms)._stack;
      } while (uVar7 < ((long)(this->lms)._cursor - (long)pRVar4 >> 4) - 1U);
    }
  }
  return bVar6;
}

Assistant:

inline bool ClauseCodeTree::ClauseMatcher::canEnterLiteral(CodeOp* op)
{
  ASS(op->isLitEnd());
  ASS_EQ(lms.top()->op, op);

  ILStruct* ils=op->getILS();
  if(ils->timestamp==tree->_curTimeStamp && ils->visited) {
    return false;
  }

  if(lms.size()>1) {
    //we have already matched and entered some index literals, so we
    //will check for compatibility of variable assignments
    if(ils->varCnt && !lms.top()->eagerlyMatched()) {
      lms.top()->doEagerMatching();
      RSTAT_MST_INC("match count", lms.size()-1, lms.top()->getILS()->matchCnt);
    }
    for(size_t ilIndex=0;ilIndex<lms.size()-1;ilIndex++) {
      ILStruct* prevILS=lms[ilIndex]->getILS();
      if(prevILS->varCnt && !lms[ilIndex]->eagerlyMatched()) {
	lms[ilIndex]->doEagerMatching();
	RSTAT_MST_INC("match count", ilIndex, lms[ilIndex]->getILS()->matchCnt);
      }

      size_t matchIndex=ils->matchCnt;
      while(matchIndex!=0) {
	matchIndex--;
	MatchInfo* mi=ils->getMatch(matchIndex);
	if(!existsCompatibleMatch(ils, mi, prevILS)) {
	  ils->deleteMatch(matchIndex); //decreases ils->matchCnt
	}
      }
      if(!ils->matchCnt) {
	return false;
      }
    }
  }

  return true;
}